

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O3

void BrotliSplitBlock(MemoryManager *m,Command_conflict *cmds,size_t num_commands,uint8_t *data,
                     size_t pos,size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
                     BlockSplit *insert_and_copy_split,BlockSplit *dist_split,
                     BlockSplitFromDecoder *literals_block_splits_decoder,
                     size_t *current_block_literals,BlockSplitFromDecoder *cmds_block_splits_decoder
                     ,size_t *current_block_cmds)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  size_t byte_ix;
  Command_conflict *pCVar12;
  undefined1 *puVar13;
  HistogramLiteral *out;
  BlockSplit *pBVar14;
  HistogramLiteral *pHVar15;
  uint8_t *puVar16;
  uint16_t *puVar17;
  void *pvVar18;
  ulong uVar19;
  ushort *puVar20;
  void *pvVar21;
  void *pvVar22;
  void *pvVar23;
  uint32_t *puVar24;
  void *pvVar25;
  HistogramCommand *pHVar26;
  uint32_t *__dest;
  uint32_t *puVar27;
  size_t sVar28;
  long lVar29;
  long lVar30;
  byte *pbVar31;
  uint *puVar32;
  void *pvVar33;
  uint *puVar34;
  uint32_t uVar35;
  HistogramPair *pHVar36;
  HistogramPair *n;
  byte bVar37;
  uint uVar38;
  byte bVar39;
  HistogramPair *pHVar40;
  ulong uVar41;
  BlockSplit *pBVar42;
  ulong uVar43;
  size_t sVar44;
  uint uVar45;
  size_t __n;
  ulong uVar46;
  size_t sVar47;
  long lVar48;
  uint16_t *puVar49;
  size_t __n_00;
  long lVar50;
  long lVar51;
  ulong uVar52;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  int iVar57;
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar58;
  undefined1 auVar56 [16];
  double dVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  double dVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  int iVar97;
  int iVar98;
  int iVar103;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  int iVar104;
  undefined1 auVar102 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  BrotliEncoderParams *in_stack_ffffffffffffefe8;
  BlockSplit *in_stack_ffffffffffffeff0;
  long local_1008;
  HistogramCommand *local_1000;
  void *local_ff8;
  uint32_t *local_ff0;
  void *local_fe0;
  void *local_fd8;
  long local_fd0;
  HistogramPair *local_fc0;
  HistogramCommand *local_fb8;
  ulong local_fa0;
  void *local_f98;
  long local_f90;
  HistogramPair *local_f88;
  ulong local_f70;
  uint32_t new_clusters [64];
  uint32_t symbols [64];
  uint32_t sizes [64];
  uint32_t remap [64];
  undefined1 local_b40 [2816];
  ulong local_40;
  double local_38;
  
  if (num_commands == 0) {
    local_ff8 = (void *)0x0;
    pHVar40 = (HistogramPair *)pos;
    if (literals_block_splits_decoder != (BlockSplitFromDecoder *)0x0) goto LAB_001256b4;
LAB_00125830:
    literal_split->num_types = 1;
    sVar28 = 0x32;
  }
  else {
    pCVar12 = cmds;
    sVar28 = num_commands;
    n = (HistogramPair *)0x0;
    do {
      pHVar36 = n;
      uVar52 = (ulong)pCVar12->insert_len_;
      n = (HistogramPair *)((long)&pHVar36->idx1 + uVar52);
      pCVar12 = pCVar12 + 1;
      sVar28 = sVar28 - 1;
    } while (sVar28 != 0);
    pHVar40 = pHVar36;
    if (n == (HistogramPair *)0x0) {
      local_ff8 = (void *)0x0;
    }
    else {
      local_ff8 = BrotliAllocate(m,(size_t)n);
    }
    puVar24 = &cmds->copy_len_;
    lVar48 = 0;
    sVar28 = num_commands;
    sVar44 = pos;
    do {
      uVar43 = sVar44 & mask;
      __n = (size_t)((Command_conflict *)(puVar24 + -1))->insert_len_;
      if (mask < uVar43 + __n) {
        __n_00 = (mask + 1) - uVar43;
        memcpy((void *)((long)local_ff8 + lVar48),data + uVar43,__n_00);
        lVar48 = lVar48 + __n_00;
        __n = __n - __n_00;
        uVar43 = 0;
      }
      if (__n != 0) {
        memcpy((void *)((long)local_ff8 + lVar48),data + uVar43,__n);
        lVar48 = lVar48 + __n;
      }
      sVar44 = (ulong)(*puVar24 & 0x1ffffff) + __n + uVar43;
      puVar24 = puVar24 + 4;
      sVar28 = sVar28 - 1;
    } while (sVar28 != 0);
    if (literals_block_splits_decoder == (BlockSplitFromDecoder *)0x0) {
      uVar43 = 100;
      if (n < (HistogramPair *)0xd480) {
        uVar43 = (ulong)(((uint)n & 0xffff) / 0x220 + 1);
      }
      if (n == (HistogramPair *)0x0) goto LAB_00125830;
      if (n < (HistogramPair *)0x80) {
        sVar28 = literal_split->num_blocks;
        uVar43 = literal_split->types_alloc_size;
        uVar52 = sVar28 + 1;
        if (uVar43 < uVar52) {
          if (uVar43 == 0) {
            uVar43 = uVar52;
          }
          do {
            uVar41 = uVar43;
            uVar43 = uVar41 * 2;
          } while (uVar41 < uVar52);
          puVar16 = (uint8_t *)BrotliAllocate(m,uVar41);
          if (literal_split->types_alloc_size != 0) {
            memcpy(puVar16,literal_split->types,literal_split->types_alloc_size);
          }
          BrotliFree(m,literal_split->types);
          literal_split->types = puVar16;
          literal_split->types_alloc_size = uVar41;
          sVar28 = literal_split->num_blocks;
          uVar52 = sVar28 + 1;
        }
        uVar43 = literal_split->lengths_alloc_size;
        if (uVar43 < uVar52) {
          if (uVar43 == 0) {
            uVar43 = uVar52;
          }
          do {
            uVar41 = uVar43;
            uVar43 = uVar41 * 2;
          } while (uVar41 < uVar52);
          puVar24 = (uint32_t *)BrotliAllocate(m,uVar41 * 4);
          if (literal_split->lengths_alloc_size != 0) {
            memcpy(puVar24,literal_split->lengths,literal_split->lengths_alloc_size << 2);
          }
          BrotliFree(m,literal_split->lengths);
          literal_split->lengths = puVar24;
          literal_split->lengths_alloc_size = uVar41;
          sVar28 = literal_split->num_blocks;
        }
        literal_split->num_types = 1;
        literal_split->types[sVar28] = '\0';
        sVar28 = literal_split->num_blocks;
        literal_split->lengths[sVar28] = (uint)n;
        literal_split->num_blocks = sVar28 + 1;
      }
      else {
        pvVar18 = BrotliAllocate(m,uVar43 * 0x410);
        lVar48 = 0;
        do {
          memset((void *)(lVar48 + (long)pvVar18),0,0x408);
          *(undefined8 *)((long)pvVar18 + lVar48 + 0x408) = 0x7ff0000000000000;
          lVar48 = lVar48 + 0x410;
        } while (uVar43 * 0x410 - lVar48 != 0);
        uVar19 = 0;
        uVar41 = 7;
        do {
          puVar13 = (undefined1 *)((uVar19 * (long)n) / uVar43);
          if (uVar19 != 0) {
            uVar41 = (ulong)(uint)((int)uVar41 * 0x41a7);
            puVar13 = puVar13 + uVar41 % ((ulong)n / uVar43);
          }
          if (n <= (HistogramPair *)(puVar13 + 0x46)) {
            puVar13 = (undefined1 *)((long)&n[-3].idx1 + 1);
          }
          plVar2 = (long *)((long)pvVar18 + uVar19 * 0x410 + 0x400);
          *plVar2 = *plVar2 + 0x46;
          lVar48 = -0x46;
          do {
            piVar1 = (int *)((long)pvVar18 +
                            (ulong)(byte)(puVar13 + (long)local_ff8)[lVar48 + 0x46] * 4 +
                            uVar19 * 0x410);
            *piVar1 = *piVar1 + 1;
            lVar48 = lVar48 + 1;
          } while (lVar48 != 0);
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar43);
        uVar41 = (ulong)((long)n * 2) / 0x46 + uVar43 + 99;
        if (uVar41 != uVar41 % uVar43) {
          uVar19 = 7;
          uVar46 = 0;
          do {
            memset(local_b40,0,0x408);
            uVar19 = (ulong)(uint)((int)uVar19 * 0x41a7);
            pbVar31 = (byte *)(uVar19 % (ulong)((long)&n[-3].idx1 + 3U) + (long)local_ff8);
            lVar48 = -0x46;
            do {
              bVar37 = *pbVar31;
              pbVar31 = pbVar31 + 1;
              *(int *)(local_b40 + (ulong)bVar37 * 4) = *(int *)(local_b40 + (ulong)bVar37 * 4) + 1;
              lVar48 = lVar48 + 1;
            } while (lVar48 != 0);
            lVar48 = (uVar46 % uVar43) * 0x410;
            plVar2 = (long *)((long)pvVar18 + lVar48 + 0x400);
            *plVar2 = *plVar2 + 0x46;
            lVar30 = 0;
            do {
              lVar51 = lVar30 * 4;
              piVar1 = (int *)((long)pvVar18 + lVar30 * 4 + lVar48);
              auVar60._0_4_ = *piVar1 + *(int *)(local_b40 + lVar51);
              auVar60._4_4_ = piVar1[1] + *(int *)(local_b40 + lVar51 + 4);
              auVar60._8_4_ = piVar1[2] + *(int *)(local_b40 + lVar51 + 8);
              auVar60._12_4_ = piVar1[3] + *(int *)(local_b40 + lVar51 + 0xc);
              *(undefined1 (*) [16])((long)pvVar18 + lVar30 * 4 + lVar48) = auVar60;
              lVar30 = lVar30 + 4;
            } while (lVar30 != 0x100);
            uVar46 = uVar46 + 1;
          } while (uVar46 < uVar41 - uVar41 % uVar43);
        }
        pvVar21 = BrotliAllocate(m,(size_t)n);
        iVar98 = (int)uVar43;
        pvVar22 = BrotliAllocate(m,(ulong)(uint)(iVar98 << 0xb));
        pvVar23 = BrotliAllocate(m,(ulong)(uint)(iVar98 * 8));
        sVar28 = (ulong)(iVar98 + 7U >> 3) * (long)n;
        if (sVar28 == 0) {
          local_f98 = (void *)0x0;
        }
        else {
          local_f98 = BrotliAllocate(m,sVar28);
        }
        pvVar25 = BrotliAllocate(m,(ulong)(uint)(iVar98 * 2));
        lVar48 = 3;
        if (10 < params->quality) {
          lVar48 = 10;
        }
        lVar30 = (long)&pHVar36->idx1 + uVar52;
        lVar51 = 0;
        do {
          uVar41 = uVar43 + 7 >> 3;
          if (uVar43 < 2) {
            memset(pvVar21,0,(size_t)n);
            pBVar42 = (BlockSplit *)0x1;
            auVar60 = _DAT_00176480;
          }
          else {
            memset(pvVar22,0,uVar43 << 0xb);
            uVar19 = 0;
            puVar32 = (uint *)((long)pvVar18 + 0x400);
            do {
              uVar46 = (ulong)*puVar32;
              if (uVar46 < 0x100) {
                dVar53 = kLog2Table[uVar46];
              }
              else {
                dVar53 = log2((double)uVar46);
              }
              *(double *)((long)pvVar22 + uVar19 * 8) = dVar53;
              uVar19 = uVar19 + 1;
              puVar32 = puVar32 + 0x104;
            } while (uVar43 != uVar19);
            pvVar33 = (void *)(uVar43 * 0x7f8 + (long)pvVar22);
            lVar50 = 0x100;
            puVar32 = (uint *)((long)pvVar18 + 0x3fc);
            do {
              lVar50 = lVar50 + -1;
              uVar19 = 0;
              puVar34 = puVar32;
              do {
                dVar59 = -2.0;
                dVar53 = *(double *)((long)pvVar22 + uVar19 * 8);
                uVar46 = (ulong)*puVar34;
                if (uVar46 != 0) {
                  if (*puVar34 < 0x100) {
                    dVar59 = kLog2Table[uVar46];
                  }
                  else {
                    dVar59 = log2((double)uVar46);
                  }
                }
                *(double *)((long)pvVar33 + uVar19 * 8) = dVar53 - dVar59;
                uVar19 = uVar19 + 1;
                puVar34 = puVar34 + 0x104;
              } while (uVar43 != uVar19);
              pvVar33 = (void *)((long)pvVar33 + uVar43 * -8);
              puVar32 = puVar32 + -1;
            } while (lVar50 != 0);
            memset(pvVar23,0,uVar43 * 8);
            memset(local_f98,0,uVar41 * (long)n);
            auVar60 = _DAT_00176480;
            pHVar40 = (HistogramPair *)0x0;
            do {
              bVar37 = *(byte *)((long)local_ff8 + (long)pHVar40);
              uVar19 = 0;
              dVar53 = 1e+99;
              do {
                dVar59 = *(double *)((long)pvVar22 + uVar19 * 8 + bVar37 * uVar43 * 8) +
                         *(double *)((long)pvVar23 + uVar19 * 8);
                *(double *)((long)pvVar23 + uVar19 * 8) = dVar59;
                if (dVar59 < dVar53) {
                  *(char *)((long)pvVar21 + (long)pHVar40) = (char)uVar19;
                  dVar53 = dVar59;
                }
                uVar19 = uVar19 + 1;
              } while (uVar43 != uVar19);
              dVar59 = 28.1;
              if (pHVar40 < (HistogramPair *)0x7d0) {
                dVar59 = (((double)(long)pHVar40 * 0.07) / 2000.0 + 0.77) * 28.1;
              }
              uVar19 = 0;
              do {
                dVar65 = *(double *)((long)pvVar23 + uVar19 * 8) - dVar53;
                *(double *)((long)pvVar23 + uVar19 * 8) = dVar65;
                if (dVar59 <= dVar65) {
                  *(double *)((long)pvVar23 + uVar19 * 8) = dVar59;
                  pbVar31 = (byte *)((long)local_f98 + (uVar19 >> 3) + (long)pHVar40 * uVar41);
                  *pbVar31 = *pbVar31 | '\x01' << ((byte)uVar19 & 7);
                }
                uVar19 = uVar19 + 1;
              } while (uVar43 != uVar19);
              pHVar40 = (HistogramPair *)((long)&pHVar40->idx1 + 1);
            } while (pHVar40 != n);
            bVar37 = *(byte *)((long)pvVar21 + -1 + (long)n);
            pvVar33 = (void *)(((long)pHVar36 + (uVar52 - 2)) * uVar41 + (long)local_f98);
            pBVar42 = (BlockSplit *)0x1;
            lVar50 = lVar30;
            do {
              if ((*(byte *)((long)pvVar33 + (ulong)(bVar37 >> 3)) >> (bVar37 & 7) & 1) != 0) {
                bVar39 = *(byte *)((long)pvVar21 + lVar50 + -2);
                pBVar42 = (BlockSplit *)((long)&pBVar42->num_types + (ulong)(bVar37 != bVar39));
                bVar37 = bVar39;
              }
              *(byte *)((long)pvVar21 + lVar50 + -2) = bVar37;
              pvVar33 = (void *)((long)pvVar33 - uVar41);
              lVar50 = lVar50 + -1;
            } while (lVar50 != 1);
          }
          if (uVar43 != 0) {
            lVar50 = uVar43 - 1;
            auVar82._8_4_ = (int)lVar50;
            auVar82._0_8_ = lVar50;
            auVar82._12_4_ = (int)((ulong)lVar50 >> 0x20);
            auVar82 = auVar82 ^ auVar60;
            lVar50 = 0;
            auVar77 = _DAT_00176470;
            auVar107 = _DAT_00176460;
            auVar111 = _DAT_00178000;
            auVar81 = _DAT_00177ff0;
            do {
              auVar94 = auVar77 ^ auVar60;
              iVar98 = auVar82._0_4_;
              iVar97 = -(uint)(iVar98 < auVar94._0_4_);
              iVar57 = auVar82._4_4_;
              auVar69._4_4_ = -(uint)(iVar57 < auVar94._4_4_);
              iVar104 = auVar82._8_4_;
              iVar103 = -(uint)(iVar104 < auVar94._8_4_);
              iVar58 = auVar82._12_4_;
              auVar69._12_4_ = -(uint)(iVar58 < auVar94._12_4_);
              auVar89._4_4_ = iVar97;
              auVar89._0_4_ = iVar97;
              auVar89._8_4_ = iVar103;
              auVar89._12_4_ = iVar103;
              auVar105 = pshuflw(in_XMM8,auVar89,0xe8);
              auVar71._4_4_ = -(uint)(auVar94._4_4_ == iVar57);
              auVar71._12_4_ = -(uint)(auVar94._12_4_ == iVar58);
              auVar71._0_4_ = auVar71._4_4_;
              auVar71._8_4_ = auVar71._12_4_;
              auVar110 = pshuflw(in_XMM9,auVar71,0xe8);
              auVar69._0_4_ = auVar69._4_4_;
              auVar69._8_4_ = auVar69._12_4_;
              auVar106 = pshuflw(auVar105,auVar69,0xe8);
              auVar94._8_4_ = 0xffffffff;
              auVar94._0_8_ = 0xffffffffffffffff;
              auVar94._12_4_ = 0xffffffff;
              auVar94 = (auVar106 | auVar110 & auVar105) ^ auVar94;
              auVar94 = packssdw(auVar94,auVar94);
              if ((auVar94 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar50) = 0x100;
              }
              auVar69 = auVar71 & auVar89 | auVar69;
              auVar94 = packssdw(auVar69,auVar69);
              auVar106._8_4_ = 0xffffffff;
              auVar106._0_8_ = 0xffffffffffffffff;
              auVar106._12_4_ = 0xffffffff;
              auVar94 = packssdw(auVar94 ^ auVar106,auVar94 ^ auVar106);
              if ((auVar94._0_4_ >> 0x10 & 1) != 0) {
                *(undefined2 *)((long)pvVar25 + lVar50 + 2) = 0x100;
              }
              auVar94 = auVar107 ^ auVar60;
              iVar97 = -(uint)(iVar98 < auVar94._0_4_);
              auVar99._4_4_ = -(uint)(iVar57 < auVar94._4_4_);
              iVar103 = -(uint)(iVar104 < auVar94._8_4_);
              auVar99._12_4_ = -(uint)(iVar58 < auVar94._12_4_);
              auVar70._4_4_ = iVar97;
              auVar70._0_4_ = iVar97;
              auVar70._8_4_ = iVar103;
              auVar70._12_4_ = iVar103;
              auVar88._4_4_ = -(uint)(auVar94._4_4_ == iVar57);
              auVar88._12_4_ = -(uint)(auVar94._12_4_ == iVar58);
              auVar88._0_4_ = auVar88._4_4_;
              auVar88._8_4_ = auVar88._12_4_;
              auVar99._0_4_ = auVar99._4_4_;
              auVar99._8_4_ = auVar99._12_4_;
              auVar94 = auVar88 & auVar70 | auVar99;
              auVar94 = packssdw(auVar94,auVar94);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar94 = packssdw(auVar94 ^ auVar9,auVar94 ^ auVar9);
              if ((auVar94 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar50 + 4) = 0x100;
              }
              auVar71 = pshufhw(auVar70,auVar70,0x84);
              auVar89 = pshufhw(auVar88,auVar88,0x84);
              auVar69 = pshufhw(auVar71,auVar99,0x84);
              auVar72._8_4_ = 0xffffffff;
              auVar72._0_8_ = 0xffffffffffffffff;
              auVar72._12_4_ = 0xffffffff;
              auVar72 = (auVar69 | auVar89 & auVar71) ^ auVar72;
              auVar71 = packssdw(auVar72,auVar72);
              if ((auVar71 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar50 + 6) = 0x100;
              }
              auVar71 = auVar111 ^ auVar60;
              iVar97 = -(uint)(iVar98 < auVar71._0_4_);
              auVar74._4_4_ = -(uint)(iVar57 < auVar71._4_4_);
              iVar103 = -(uint)(iVar104 < auVar71._8_4_);
              auVar74._12_4_ = -(uint)(iVar58 < auVar71._12_4_);
              auVar90._4_4_ = iVar97;
              auVar90._0_4_ = iVar97;
              auVar90._8_4_ = iVar103;
              auVar90._12_4_ = iVar103;
              auVar94 = pshuflw(auVar94,auVar90,0xe8);
              auVar73._4_4_ = -(uint)(auVar71._4_4_ == iVar57);
              auVar73._12_4_ = -(uint)(auVar71._12_4_ == iVar58);
              auVar73._0_4_ = auVar73._4_4_;
              auVar73._8_4_ = auVar73._12_4_;
              in_XMM9 = pshuflw(auVar110 & auVar105,auVar73,0xe8);
              in_XMM9 = in_XMM9 & auVar94;
              auVar74._0_4_ = auVar74._4_4_;
              auVar74._8_4_ = auVar74._12_4_;
              auVar94 = pshuflw(auVar94,auVar74,0xe8);
              auVar105._8_4_ = 0xffffffff;
              auVar105._0_8_ = 0xffffffffffffffff;
              auVar105._12_4_ = 0xffffffff;
              auVar105 = (auVar94 | in_XMM9) ^ auVar105;
              auVar94 = packssdw(auVar105,auVar105);
              if ((auVar94 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar50 + 8) = 0x100;
              }
              auVar74 = auVar73 & auVar90 | auVar74;
              auVar94 = packssdw(auVar74,auVar74);
              auVar110._8_4_ = 0xffffffff;
              auVar110._0_8_ = 0xffffffffffffffff;
              auVar110._12_4_ = 0xffffffff;
              auVar94 = packssdw(auVar94 ^ auVar110,auVar94 ^ auVar110);
              if ((auVar94 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar50 + 10) = 0x100;
              }
              auVar94 = auVar81 ^ auVar60;
              iVar98 = -(uint)(iVar98 < auVar94._0_4_);
              auVar100._4_4_ = -(uint)(iVar57 < auVar94._4_4_);
              iVar104 = -(uint)(iVar104 < auVar94._8_4_);
              auVar100._12_4_ = -(uint)(iVar58 < auVar94._12_4_);
              auVar75._4_4_ = iVar98;
              auVar75._0_4_ = iVar98;
              auVar75._8_4_ = iVar104;
              auVar75._12_4_ = iVar104;
              auVar91._4_4_ = -(uint)(auVar94._4_4_ == iVar57);
              auVar91._12_4_ = -(uint)(auVar94._12_4_ == iVar58);
              auVar91._0_4_ = auVar91._4_4_;
              auVar91._8_4_ = auVar91._12_4_;
              auVar100._0_4_ = auVar100._4_4_;
              auVar100._8_4_ = auVar100._12_4_;
              auVar94 = auVar91 & auVar75 | auVar100;
              auVar94 = packssdw(auVar94,auVar94);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              in_XMM8 = packssdw(auVar94 ^ auVar10,auVar94 ^ auVar10);
              if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar50 + 0xc) = 0x100;
              }
              auVar94 = pshufhw(auVar75,auVar75,0x84);
              auVar69 = pshufhw(auVar91,auVar91,0x84);
              auVar71 = pshufhw(auVar94,auVar100,0x84);
              auVar76._8_4_ = 0xffffffff;
              auVar76._0_8_ = 0xffffffffffffffff;
              auVar76._12_4_ = 0xffffffff;
              auVar76 = (auVar71 | auVar69 & auVar94) ^ auVar76;
              auVar94 = packssdw(auVar76,auVar76);
              if ((auVar94 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar50 + 0xe) = 0x100;
              }
              lVar29 = auVar77._8_8_;
              auVar77._0_8_ = auVar77._0_8_ + 8;
              auVar77._8_8_ = lVar29 + 8;
              lVar29 = auVar107._8_8_;
              auVar107._0_8_ = auVar107._0_8_ + 8;
              auVar107._8_8_ = lVar29 + 8;
              lVar29 = auVar111._8_8_;
              auVar111._0_8_ = auVar111._0_8_ + 8;
              auVar111._8_8_ = lVar29 + 8;
              lVar29 = auVar81._8_8_;
              auVar81._0_8_ = auVar81._0_8_ + 8;
              auVar81._8_8_ = lVar29 + 8;
              lVar50 = lVar50 + 0x10;
            } while (uVar41 * 0x10 != lVar50);
          }
          lVar50 = 0;
          uVar11 = 0;
          do {
            if (*(short *)((long)pvVar25 + (ulong)*(byte *)((long)pvVar21 + lVar50) * 2) == 0x100) {
              *(ushort *)((long)pvVar25 + (ulong)*(byte *)((long)pvVar21 + lVar50) * 2) = uVar11;
              uVar11 = uVar11 + 1;
            }
            lVar50 = lVar50 + 1;
          } while (lVar30 != lVar50);
          lVar50 = 0;
          do {
            *(undefined1 *)((long)pvVar21 + lVar50) =
                 *(undefined1 *)((long)pvVar25 + (ulong)*(byte *)((long)pvVar21 + lVar50) * 2);
            lVar50 = lVar50 + 1;
          } while (lVar30 != lVar50);
          uVar43 = (ulong)uVar11;
          if (uVar11 != 0) {
            lVar50 = 0;
            do {
              memset((void *)((long)pvVar18 + lVar50),0,0x408);
              *(undefined8 *)((long)pvVar18 + lVar50 + 0x408) = 0x7ff0000000000000;
              lVar50 = lVar50 + 0x410;
            } while (uVar43 * 0x410 - lVar50 != 0);
          }
          lVar50 = 0;
          do {
            lVar29 = (ulong)*(byte *)((long)pvVar21 + lVar50) * 0x410;
            piVar1 = (int *)((long)pvVar18 + (ulong)*(byte *)((long)local_ff8 + lVar50) * 4 + lVar29
                            );
            *piVar1 = *piVar1 + 1;
            plVar2 = (long *)((long)pvVar18 + lVar29 + 0x400);
            *plVar2 = *plVar2 + 1;
            lVar50 = lVar50 + 1;
          } while (lVar30 != lVar50);
          lVar51 = lVar51 + 1;
        } while (lVar51 != lVar48);
        BrotliFree(m,pvVar22);
        BrotliFree(m,pvVar23);
        BrotliFree(m,local_f98);
        BrotliFree(m,pvVar25);
        BrotliFree(m,pvVar18);
        if (pBVar42 == (BlockSplit *)0x0) {
          out = (HistogramLiteral *)BrotliAllocate(m,0x3cf0);
          local_fc0 = (HistogramPair *)BrotliAllocate(m,0x3c);
          local_f70 = 0xf;
          sVar28 = 0;
          pvVar18 = (void *)0x0;
          local_ff0 = (uint32_t *)0x0;
          local_1000 = (HistogramCommand *)0x0;
        }
        else {
          sVar28 = (long)pBVar42 * 4;
          local_ff0 = (uint32_t *)BrotliAllocate(m,sVar28);
          pvVar18 = BrotliAllocate(m,sVar28);
          uVar43 = (long)pBVar42 * 0x10 + 0x3f0;
          local_f70 = uVar43 >> 6;
          if (uVar43 < 0x40) {
            local_fc0 = (HistogramPair *)0x0;
            out = (HistogramLiteral *)0x0;
          }
          else {
            out = (HistogramLiteral *)BrotliAllocate(m,local_f70 * 0x410);
            local_fc0 = (HistogramPair *)BrotliAllocate(m,local_f70 * 4);
          }
          pBVar14 = (BlockSplit *)0x40;
          if (pBVar42 < (BlockSplit *)0x40) {
            pBVar14 = pBVar42;
          }
          local_1000 = (HistogramCommand *)BrotliAllocate(m,(long)pBVar14 * 0x410);
        }
        local_f88 = (HistogramPair *)BrotliAllocate(m,0xc018);
        lVar30 = 0;
        memset(sizes,0,0x100);
        memset(new_clusters,0,0x100);
        memset(symbols,0,0x100);
        memset(remap,0,0x100);
        memset(pvVar18,0,sVar28);
        lVar48 = 0;
        do {
          piVar1 = (int *)((long)pvVar18 + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          if (((long)pHVar36 + (uVar52 - 1) == lVar48) ||
             (*(char *)((long)pvVar21 + lVar48) != *(char *)((long)pvVar21 + lVar48 + 1))) {
            lVar30 = lVar30 + 1;
          }
          lVar48 = lVar48 + 1;
        } while ((long)&pHVar36->idx1 + uVar52 != lVar48);
        in_stack_ffffffffffffeff0 = pBVar42;
        if (pBVar42 == (BlockSplit *)0x0) {
          local_fd8 = (void *)0x0;
        }
        else {
          local_fb8 = (HistogramCommand *)0x0;
          local_f90 = 0;
          local_fe0 = (void *)0x0;
          local_fd8 = (void *)0x0;
          local_1008 = 0;
          puVar24 = local_ff0;
          uVar52 = local_f70;
          do {
            pBVar14 = (BlockSplit *)0x40;
            if (pBVar42 < (BlockSplit *)0x40) {
              pBVar14 = pBVar42;
            }
            lVar48 = (long)&pBVar14->num_types + (ulong)(pBVar14 == (BlockSplit *)0x0);
            lVar30 = 0;
            do {
              pHVar15 = (HistogramLiteral *)((long)local_1000 + lVar30 * 0x410);
              memset(pHVar15,0,0x408);
              ((HistogramLiteral *)((long)local_1000 + lVar30 * 0x410))->bit_cost_ = INFINITY;
              if (*(int *)((long)pvVar18 + ((long)local_fe0 + lVar30) * 4) != 0) {
                uVar43 = 0;
                do {
                  pHVar15->data_[*(byte *)((long)local_ff8 + uVar43 + local_1008)] =
                       pHVar15->data_[*(byte *)((long)local_ff8 + uVar43 + local_1008)] + 1;
                  uVar43 = uVar43 + 1;
                  pHVar15->total_count_ = uVar43;
                } while (uVar43 < *(uint *)((long)pvVar18 + ((long)local_fe0 + lVar30) * 4));
                local_1008 = local_1008 + uVar43;
              }
              dVar53 = BrotliPopulationCostLiteral(pHVar15);
              pHVar15->bit_cost_ = dVar53;
              new_clusters[lVar30] = (uint32_t)lVar30;
              symbols[lVar30] = (uint32_t)lVar30;
              sizes[lVar30] = 1;
              lVar30 = lVar30 + 1;
            } while (lVar30 != lVar48);
            sVar28 = (long)in_stack_ffffffffffffeff0 - (long)local_fe0;
            if (0x3f < sVar28) {
              sVar28 = 0x40;
            }
            sVar28 = BrotliHistogramCombineLiteral
                               ((HistogramLiteral *)local_1000,sizes,symbols,new_clusters,local_f88,
                                sVar28,sVar28,0x40,0x800);
            uVar43 = (long)local_fb8 + sVar28;
            if (local_f70 < uVar43) {
              uVar41 = local_f70;
              if (local_f70 == 0) {
                uVar41 = uVar43;
              }
              do {
                uVar19 = uVar41;
                uVar41 = uVar19 * 2;
              } while (uVar19 < uVar43);
              pHVar15 = (HistogramLiteral *)BrotliAllocate(m,uVar19 * 0x410);
              if (local_f70 != 0) {
                memcpy(pHVar15,out,local_f70 * 0x410);
              }
              BrotliFree(m,out);
              out = pHVar15;
              local_f70 = uVar19;
            }
            uVar43 = local_f90 + sVar28;
            if (uVar52 < uVar43) {
              uVar41 = uVar52;
              if (uVar52 == 0) {
                uVar41 = uVar43;
              }
              do {
                uVar19 = uVar41;
                uVar41 = uVar19 * 2;
              } while (uVar19 < uVar43);
              puVar27 = (uint32_t *)BrotliAllocate(m,uVar19 * 4);
              if (uVar52 != 0) {
                memcpy(puVar27,local_fc0,uVar52 << 2);
              }
              BrotliFree(m,local_fc0);
              uVar52 = uVar19;
              local_fc0 = (HistogramPair *)puVar27;
            }
            if (sVar28 != 0) {
              pHVar15 = out + (long)local_fb8;
              sVar44 = 0;
              do {
                uVar45 = new_clusters[sVar44];
                memcpy(pHVar15,(HistogramLiteral *)((long)local_1000 + (ulong)uVar45 * 0x410),0x410)
                ;
                *(uint32_t *)((long)local_fc0 + (local_f90 + sVar44) * 4) = sizes[uVar45];
                remap[new_clusters[sVar44]] = (uint32_t)sVar44;
                sVar44 = sVar44 + 1;
                pHVar15 = pHVar15 + 1;
              } while (sVar28 != sVar44);
              local_fb8 = (HistogramCommand *)((long)local_fb8 + sVar44);
              local_f90 = local_f90 + sVar44;
            }
            lVar30 = 0;
            do {
              puVar24[lVar30] = remap[symbols[lVar30]] + (int)local_fd8;
              lVar30 = lVar30 + 1;
            } while (lVar48 != lVar30);
            local_fd8 = (void *)((long)local_fd8 + sVar28);
            local_fe0 = (void *)((long)local_fe0 + 0x40);
            pBVar42 = (BlockSplit *)&pBVar42[-2].types_alloc_size;
            puVar24 = puVar24 + 0x40;
          } while (local_fe0 < in_stack_ffffffffffffeff0);
        }
        BrotliFree(m,local_1000);
        uVar52 = ((ulong)local_fd8 >> 1) * (long)local_fd8;
        if ((ulong)((long)local_fd8 << 6) < uVar52) {
          uVar52 = (long)local_fd8 << 6;
        }
        if (0x800 < uVar52) {
          BrotliFree(m,local_f88);
          local_f88 = (HistogramPair *)BrotliAllocate(m,uVar52 * 0x18 + 0x18);
        }
        if (local_fd8 == (void *)0x0) {
          puVar24 = (uint32_t *)0x0;
        }
        else {
          puVar24 = (uint32_t *)BrotliAllocate(m,(long)local_fd8 * 4);
          auVar77 = _DAT_00176d80;
          auVar60 = _DAT_00176480;
          lVar48 = (long)local_fd8 - 1;
          auVar54._8_4_ = (int)lVar48;
          auVar54._0_8_ = lVar48;
          auVar54._12_4_ = (int)((ulong)lVar48 >> 0x20);
          uVar43 = 0;
          auVar54 = auVar54 ^ _DAT_00176480;
          auVar61 = _DAT_00176470;
          do {
            bVar4 = auVar54._0_4_ < SUB164(auVar61 ^ auVar60,0);
            iVar98 = auVar54._4_4_;
            iVar57 = SUB164(auVar61 ^ auVar60,4);
            if ((bool)(~(iVar98 < iVar57 || iVar57 == iVar98 && bVar4) & 1)) {
              puVar24[uVar43] = (uint32_t)uVar43;
            }
            if (iVar98 >= iVar57 && (iVar57 != iVar98 || !bVar4)) {
              puVar24[uVar43 + 1] = (uint32_t)uVar43 + 1;
            }
            uVar43 = uVar43 + 2;
            lVar48 = auVar61._8_8_;
            auVar61._0_8_ = auVar61._0_8_ + auVar77._0_8_;
            auVar61._8_8_ = lVar48 + auVar77._8_8_;
          } while (((long)local_fd8 + 1U & 0xfffffffffffffffe) != uVar43);
        }
        pHVar40 = local_f88;
        sVar28 = BrotliHistogramCombineLiteral
                           (out,&local_fc0->idx1,local_ff0,puVar24,local_f88,(size_t)local_fd8,
                            (size_t)in_stack_ffffffffffffeff0,0x100,uVar52);
        BrotliFree(m,local_f88);
        BrotliFree(m,local_fc0);
        if (local_fd8 == (void *)0x0) {
          local_fe0 = (void *)0x0;
        }
        else {
          local_fe0 = BrotliAllocate(m,(long)local_fd8 << 2);
          memset(local_fe0,0xff,(long)local_fd8 << 2);
        }
        if (in_stack_ffffffffffffeff0 != (BlockSplit *)0x0) {
          iVar98 = 0;
          pBVar42 = (BlockSplit *)0x0;
          local_fd0 = 0;
          do {
            memset(local_b40,0,0x408);
            local_b40._1032_8_ = INFINITY;
            if (*(int *)((long)pvVar18 + (long)pBVar42 * 4) != 0) {
              uVar52 = 0;
              do {
                *(int *)(local_b40 + (ulong)*(byte *)((long)local_ff8 + uVar52 + local_fd0) * 4) =
                     *(int *)(local_b40 + (ulong)*(byte *)((long)local_ff8 + uVar52 + local_fd0) * 4
                             ) + 1;
                uVar52 = uVar52 + 1;
              } while (uVar52 < *(uint *)((long)pvVar18 + (long)pBVar42 * 4));
              local_fd0 = local_fd0 + uVar52;
              local_b40._1024_8_ = uVar52;
            }
            puVar13 = (undefined1 *)0x0;
            if (pBVar42 != (BlockSplit *)0x0) {
              puVar13 = (undefined1 *)((long)&pBVar42[-1].lengths_alloc_size + 7);
            }
            uVar45 = local_ff0[(long)puVar13];
            uVar52 = (ulong)uVar45;
            local_1000 = (HistogramCommand *)
                         BrotliHistogramBitCostDistanceLiteral
                                   ((HistogramLiteral *)local_b40,out + uVar52);
            if (sVar28 != 0) {
              sVar44 = 0;
              do {
                dVar53 = BrotliHistogramBitCostDistanceLiteral
                                   ((HistogramLiteral *)local_b40,out + puVar24[sVar44]);
                if (dVar53 < (double)local_1000) {
                  uVar52 = (ulong)puVar24[sVar44];
                  local_1000 = (HistogramCommand *)dVar53;
                }
                uVar45 = (uint)uVar52;
                sVar44 = sVar44 + 1;
              } while (sVar28 != sVar44);
            }
            local_ff0[(long)pBVar42] = uVar45;
            if (*(int *)((long)local_fe0 + uVar52 * 4) == -1) {
              *(int *)((long)local_fe0 + uVar52 * 4) = iVar98;
              iVar98 = iVar98 + 1;
            }
            pBVar42 = (BlockSplit *)((long)&pBVar42->num_types + 1);
          } while (pBVar42 != in_stack_ffffffffffffeff0);
        }
        BrotliFree(m,puVar24);
        BrotliFree(m,out);
        pBVar42 = (BlockSplit *)literal_split->types_alloc_size;
        if (pBVar42 < in_stack_ffffffffffffeff0) {
          if (pBVar42 == (BlockSplit *)0x0) {
            pBVar42 = in_stack_ffffffffffffeff0;
          }
          do {
            pBVar14 = pBVar42;
            pBVar42 = (BlockSplit *)((long)pBVar14 * 2);
          } while (pBVar14 < in_stack_ffffffffffffeff0);
          puVar16 = (uint8_t *)BrotliAllocate(m,(size_t)pBVar14);
          if (literal_split->types_alloc_size != 0) {
            memcpy(puVar16,literal_split->types,literal_split->types_alloc_size);
          }
          BrotliFree(m,literal_split->types);
          literal_split->types = puVar16;
          literal_split->types_alloc_size = (size_t)pBVar14;
        }
        pBVar42 = (BlockSplit *)literal_split->lengths_alloc_size;
        if (pBVar42 < in_stack_ffffffffffffeff0) {
          if (pBVar42 == (BlockSplit *)0x0) {
            pBVar42 = in_stack_ffffffffffffeff0;
          }
          do {
            pBVar14 = pBVar42;
            pBVar42 = (BlockSplit *)((long)pBVar14 * 2);
          } while (pBVar14 < in_stack_ffffffffffffeff0);
          puVar24 = (uint32_t *)BrotliAllocate(m,(long)pBVar14 * 4);
          if (literal_split->lengths_alloc_size != 0) {
            memcpy(puVar24,literal_split->lengths,literal_split->lengths_alloc_size << 2);
          }
          BrotliFree(m,literal_split->lengths);
          literal_split->lengths = puVar24;
          literal_split->lengths_alloc_size = (size_t)pBVar14;
LAB_00126b12:
          uVar45 = 0;
          sVar28 = 0;
          uVar35 = 0;
          pBVar42 = (BlockSplit *)0x0;
          do {
            uVar35 = uVar35 + *(int *)((long)pvVar18 + (long)pBVar42 * 4);
            pHVar40 = (HistogramPair *)(ulong)local_ff0[(long)pBVar42];
            if (((BlockSplit *)((long)&in_stack_ffffffffffffeff0[-1].lengths_alloc_size + 7U) ==
                 pBVar42) ||
               (local_ff0[(long)pBVar42] != local_ff0[(long)((long)&pBVar42->num_types + 1)])) {
              uVar38 = uVar45 & 0xff;
              uVar3 = *(uint *)((long)local_fe0 + (long)pHVar40 * 4);
              bVar39 = (byte)uVar3;
              literal_split->types[sVar28] = bVar39;
              bVar37 = (byte)uVar45;
              uVar45 = uVar3;
              if (bVar39 < bVar37) {
                uVar45 = uVar38;
              }
              pHVar40 = (HistogramPair *)(ulong)uVar45;
              literal_split->lengths[sVar28] = uVar35;
              sVar28 = sVar28 + 1;
              uVar35 = 0;
            }
            pBVar42 = (BlockSplit *)((long)&pBVar42->num_types + 1);
          } while (in_stack_ffffffffffffeff0 != pBVar42);
          sVar44 = (ulong)(uVar45 & 0xff) + 1;
        }
        else {
          if (in_stack_ffffffffffffeff0 != (BlockSplit *)0x0) goto LAB_00126b12;
          sVar44 = 1;
          sVar28 = 0;
        }
        literal_split->num_blocks = sVar28;
        literal_split->num_types = sVar44;
        BrotliFree(m,local_fe0);
        BrotliFree(m,pvVar18);
        BrotliFree(m,local_ff0);
        BrotliFree(m,pvVar21);
      }
      sVar28 = 0x32;
    }
    else {
LAB_001256b4:
      BrotliSplitBlockLiteralsFromStored
                (m,cmds,num_commands,pos,(size_t)pHVar40,literal_split,literals_block_splits_decoder
                 ,current_block_literals);
      sVar28 = 1;
    }
  }
  BrotliFree(m,local_ff8);
  if (num_commands == 0) {
    if (cmds_block_splits_decoder != (BlockSplitFromDecoder *)0x0) {
      local_fe0 = (void *)0x0;
      goto LAB_00126d11;
    }
    insert_and_copy_split->num_types = 1;
    BrotliFree(m,(void *)0x0);
    dVar53 = extraout_XMM0_Qa_01;
  }
  else {
    local_fe0 = BrotliAllocate(m,num_commands * 2);
    puVar17 = &cmds->cmd_prefix_;
    sVar44 = 0;
    do {
      *(uint16_t *)((long)local_fe0 + sVar44 * 2) = *puVar17;
      sVar44 = sVar44 + 1;
      puVar17 = puVar17 + 8;
    } while (num_commands != sVar44);
    if (cmds_block_splits_decoder == (BlockSplitFromDecoder *)0x0) {
      uVar52 = 0x32;
      if (num_commands < 0x6784) {
        uVar52 = (ulong)(((uint)num_commands & 0xffff) / 0x212 + 1);
      }
      if (num_commands < 0x80) {
        sVar44 = insert_and_copy_split->num_blocks;
        uVar43 = insert_and_copy_split->types_alloc_size;
        uVar52 = sVar44 + 1;
        if (uVar43 < uVar52) {
          if (uVar43 == 0) {
            uVar43 = uVar52;
          }
          do {
            uVar41 = uVar43;
            uVar43 = uVar41 * 2;
          } while (uVar41 < uVar52);
          puVar16 = (uint8_t *)BrotliAllocate(m,uVar41);
          if (insert_and_copy_split->types_alloc_size != 0) {
            memcpy(puVar16,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
          }
          BrotliFree(m,insert_and_copy_split->types);
          insert_and_copy_split->types = puVar16;
          insert_and_copy_split->types_alloc_size = uVar41;
          sVar44 = insert_and_copy_split->num_blocks;
          uVar52 = sVar44 + 1;
        }
        uVar43 = insert_and_copy_split->lengths_alloc_size;
        if (uVar43 < uVar52) {
          if (uVar43 == 0) {
            uVar43 = uVar52;
          }
          do {
            uVar41 = uVar43;
            uVar43 = uVar41 * 2;
          } while (uVar41 < uVar52);
          puVar24 = (uint32_t *)BrotliAllocate(m,uVar41 * 4);
          if (insert_and_copy_split->lengths_alloc_size != 0) {
            memcpy(puVar24,insert_and_copy_split->lengths,
                   insert_and_copy_split->lengths_alloc_size << 2);
          }
          BrotliFree(m,insert_and_copy_split->lengths);
          insert_and_copy_split->lengths = puVar24;
          insert_and_copy_split->lengths_alloc_size = uVar41;
          sVar44 = insert_and_copy_split->num_blocks;
        }
        insert_and_copy_split->num_types = 1;
        insert_and_copy_split->types[sVar44] = '\0';
        sVar44 = insert_and_copy_split->num_blocks;
        insert_and_copy_split->lengths[sVar44] = (uint)num_commands;
        insert_and_copy_split->num_blocks = sVar44 + 1;
      }
      else {
        pvVar18 = BrotliAllocate(m,uVar52 * 0xb10);
        lVar48 = 0;
        do {
          memset((void *)(lVar48 + (long)pvVar18),0,0xb08);
          *(undefined8 *)((long)pvVar18 + lVar48 + 0xb08) = 0x7ff0000000000000;
          lVar48 = lVar48 + 0xb10;
        } while (uVar52 * 0xb10 - lVar48 != 0);
        uVar41 = 0;
        uVar43 = 7;
        do {
          uVar19 = (uVar41 * num_commands) / uVar52;
          if (uVar41 != 0) {
            uVar43 = (ulong)(uint)((int)uVar43 * 0x41a7);
            uVar19 = uVar19 + uVar43 % (num_commands / uVar52);
          }
          if (num_commands <= uVar19 + 0x28) {
            uVar19 = num_commands - 0x29;
          }
          plVar2 = (long *)((long)pvVar18 + uVar41 * 0xb10 + 0xb00);
          *plVar2 = *plVar2 + 0x28;
          lVar48 = 0;
          do {
            piVar1 = (int *)((long)pvVar18 +
                            (ulong)*(ushort *)((long)local_fe0 + lVar48 * 2 + uVar19 * 2) * 4 +
                            uVar41 * 0xb10);
            *piVar1 = *piVar1 + 1;
            lVar48 = lVar48 + 1;
          } while (lVar48 != 0x28);
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar52);
        uVar43 = (num_commands * 2) / 0x28 + uVar52 + 99;
        if (uVar43 != uVar43 % uVar52) {
          uVar41 = 7;
          uVar19 = 0;
          do {
            memset(local_b40,0,0xb08);
            uVar41 = (ulong)(uint)((int)uVar41 * 0x41a7);
            puVar20 = (ushort *)((long)local_fe0 + (uVar41 % (num_commands - 0x27)) * 2);
            lVar48 = -0x28;
            do {
              uVar11 = *puVar20;
              puVar20 = puVar20 + 1;
              *(int *)(local_b40 + (ulong)uVar11 * 4) = *(int *)(local_b40 + (ulong)uVar11 * 4) + 1;
              lVar48 = lVar48 + 1;
            } while (lVar48 != 0);
            lVar48 = (uVar19 % uVar52) * 0xb10;
            plVar2 = (long *)((long)pvVar18 + lVar48 + 0xb00);
            *plVar2 = *plVar2 + 0x28;
            lVar30 = 0;
            do {
              lVar51 = lVar30 * 4;
              piVar1 = (int *)((long)pvVar18 + lVar30 * 4 + lVar48);
              auVar62._0_4_ = *piVar1 + *(int *)(local_b40 + lVar51);
              auVar62._4_4_ = piVar1[1] + *(int *)(local_b40 + lVar51 + 4);
              auVar62._8_4_ = piVar1[2] + *(int *)(local_b40 + lVar51 + 8);
              auVar62._12_4_ = piVar1[3] + *(int *)(local_b40 + lVar51 + 0xc);
              *(undefined1 (*) [16])((long)pvVar18 + lVar30 * 4 + lVar48) = auVar62;
              lVar30 = lVar30 + 4;
            } while (lVar30 != 0x2c0);
            uVar19 = uVar19 + 1;
          } while (uVar19 < uVar43 - uVar43 % uVar52);
        }
        pvVar21 = BrotliAllocate(m,num_commands);
        iVar98 = (int)uVar52;
        pvVar22 = BrotliAllocate(m,uVar52 * 0x1600);
        pvVar23 = BrotliAllocate(m,(ulong)(uint)(iVar98 * 8));
        sVar44 = (iVar98 + 7U >> 3) * num_commands;
        if (sVar44 == 0) {
          local_fd8 = (void *)0x0;
        }
        else {
          local_fd8 = BrotliAllocate(m,sVar44);
        }
        pvVar25 = BrotliAllocate(m,(ulong)(uint)(iVar98 * 2));
        lVar48 = 3;
        if (10 < params->quality) {
          lVar48 = 10;
        }
        lVar30 = 0;
        do {
          uVar43 = uVar52 + 7 >> 3;
          if (uVar52 < 2) {
            memset(pvVar21,0,num_commands);
            pBVar42 = (BlockSplit *)0x1;
            auVar60 = _DAT_00176480;
          }
          else {
            memset(pvVar22,0,uVar52 * 0x1600);
            uVar41 = 0;
            puVar32 = (uint *)((long)pvVar18 + 0xb00);
            do {
              uVar19 = (ulong)*puVar32;
              if (uVar19 < 0x100) {
                dVar53 = kLog2Table[uVar19];
              }
              else {
                dVar53 = log2((double)uVar19);
              }
              *(double *)((long)pvVar22 + uVar41 * 8) = dVar53;
              uVar41 = uVar41 + 1;
              puVar32 = puVar32 + 0x2c4;
            } while (uVar52 != uVar41);
            pvVar33 = (void *)(uVar52 * 0x15f8 + (long)pvVar22);
            lVar51 = 0x2c0;
            puVar32 = (uint *)((long)pvVar18 + 0xafc);
            do {
              lVar51 = lVar51 + -1;
              uVar41 = 0;
              puVar34 = puVar32;
              do {
                dVar59 = -2.0;
                dVar53 = *(double *)((long)pvVar22 + uVar41 * 8);
                uVar19 = (ulong)*puVar34;
                if (uVar19 != 0) {
                  if (*puVar34 < 0x100) {
                    dVar59 = kLog2Table[uVar19];
                  }
                  else {
                    dVar59 = log2((double)uVar19);
                  }
                }
                *(double *)((long)pvVar33 + uVar41 * 8) = dVar53 - dVar59;
                uVar41 = uVar41 + 1;
                puVar34 = puVar34 + 0x2c4;
              } while (uVar52 != uVar41);
              pvVar33 = (void *)((long)pvVar33 + uVar52 * -8);
              puVar32 = puVar32 + -1;
            } while (lVar51 != 0);
            memset(pvVar23,0,uVar52 * 8);
            memset(local_fd8,0,uVar43 * num_commands);
            auVar60 = _DAT_00176480;
            uVar41 = 0;
            do {
              uVar11 = *(ushort *)((long)local_fe0 + uVar41 * 2);
              uVar19 = 0;
              dVar53 = 1e+99;
              do {
                dVar59 = *(double *)((long)pvVar22 + uVar19 * 8 + uVar11 * uVar52 * 8) +
                         *(double *)((long)pvVar23 + uVar19 * 8);
                *(double *)((long)pvVar23 + uVar19 * 8) = dVar59;
                if (dVar59 < dVar53) {
                  *(char *)((long)pvVar21 + uVar41) = (char)uVar19;
                  dVar53 = dVar59;
                }
                uVar19 = uVar19 + 1;
              } while (uVar52 != uVar19);
              dVar59 = 13.5;
              if (uVar41 < 2000) {
                dVar59 = (((double)(long)uVar41 * 0.07) / 2000.0 + 0.77) * 13.5;
              }
              uVar19 = 0;
              do {
                dVar65 = *(double *)((long)pvVar23 + uVar19 * 8) - dVar53;
                *(double *)((long)pvVar23 + uVar19 * 8) = dVar65;
                if (dVar59 <= dVar65) {
                  *(double *)((long)pvVar23 + uVar19 * 8) = dVar59;
                  pbVar31 = (byte *)((long)local_fd8 + (uVar19 >> 3) + uVar41 * uVar43);
                  *pbVar31 = *pbVar31 | '\x01' << ((byte)uVar19 & 7);
                }
                uVar19 = uVar19 + 1;
              } while (uVar52 != uVar19);
              uVar41 = uVar41 + 1;
            } while (uVar41 != num_commands);
            bVar37 = *(byte *)((long)pvVar21 + (num_commands - 1));
            pvVar33 = (void *)((num_commands - 2) * uVar43 + (long)local_fd8);
            pBVar42 = (BlockSplit *)0x1;
            sVar44 = num_commands;
            do {
              if ((*(byte *)((long)pvVar33 + (ulong)(bVar37 >> 3)) >> (bVar37 & 7) & 1) != 0) {
                bVar39 = *(byte *)((long)pvVar21 + (sVar44 - 2));
                pBVar42 = (BlockSplit *)((long)&pBVar42->num_types + (ulong)(bVar37 != bVar39));
                bVar37 = bVar39;
              }
              *(byte *)((long)pvVar21 + (sVar44 - 2)) = bVar37;
              pvVar33 = (void *)((long)pvVar33 - uVar43);
              sVar44 = sVar44 - 1;
            } while (sVar44 != 1);
          }
          if (uVar52 != 0) {
            lVar51 = uVar52 - 1;
            auVar55._8_4_ = (int)lVar51;
            auVar55._0_8_ = lVar51;
            auVar55._12_4_ = (int)((ulong)lVar51 >> 0x20);
            auVar55 = auVar55 ^ auVar60;
            lVar51 = 0;
            auVar63 = _DAT_00176470;
            auVar66 = _DAT_00176460;
            auVar67 = _DAT_00178000;
            auVar68 = _DAT_00177ff0;
            do {
              auVar77 = auVar63 ^ auVar60;
              iVar98 = auVar55._0_4_;
              iVar97 = -(uint)(iVar98 < auVar77._0_4_);
              iVar57 = auVar55._4_4_;
              auVar79._4_4_ = -(uint)(iVar57 < auVar77._4_4_);
              iVar104 = auVar55._8_4_;
              iVar103 = -(uint)(iVar104 < auVar77._8_4_);
              iVar58 = auVar55._12_4_;
              auVar79._12_4_ = -(uint)(iVar58 < auVar77._12_4_);
              auVar92._4_4_ = iVar97;
              auVar92._0_4_ = iVar97;
              auVar92._8_4_ = iVar103;
              auVar92._12_4_ = iVar103;
              auVar107 = pshuflw(in_XMM8,auVar92,0xe8);
              auVar78._4_4_ = -(uint)(auVar77._4_4_ == iVar57);
              auVar78._12_4_ = -(uint)(auVar77._12_4_ == iVar58);
              auVar78._0_4_ = auVar78._4_4_;
              auVar78._8_4_ = auVar78._12_4_;
              auVar111 = pshuflw(in_XMM9,auVar78,0xe8);
              auVar79._0_4_ = auVar79._4_4_;
              auVar79._8_4_ = auVar79._12_4_;
              auVar77 = pshuflw(auVar107,auVar79,0xe8);
              auVar108._8_4_ = 0xffffffff;
              auVar108._0_8_ = 0xffffffffffffffff;
              auVar108._12_4_ = 0xffffffff;
              auVar108 = (auVar77 | auVar111 & auVar107) ^ auVar108;
              auVar77 = packssdw(auVar108,auVar108);
              if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar51) = 0x100;
              }
              auVar79 = auVar78 & auVar92 | auVar79;
              auVar77 = packssdw(auVar79,auVar79);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar77 = packssdw(auVar77 ^ auVar5,auVar77 ^ auVar5);
              if ((auVar77._0_4_ >> 0x10 & 1) != 0) {
                *(undefined2 *)((long)pvVar25 + lVar51 + 2) = 0x100;
              }
              auVar77 = auVar66 ^ auVar60;
              iVar97 = -(uint)(iVar98 < auVar77._0_4_);
              auVar101._4_4_ = -(uint)(iVar57 < auVar77._4_4_);
              iVar103 = -(uint)(iVar104 < auVar77._8_4_);
              auVar101._12_4_ = -(uint)(iVar58 < auVar77._12_4_);
              auVar80._4_4_ = iVar97;
              auVar80._0_4_ = iVar97;
              auVar80._8_4_ = iVar103;
              auVar80._12_4_ = iVar103;
              auVar93._4_4_ = -(uint)(auVar77._4_4_ == iVar57);
              auVar93._12_4_ = -(uint)(auVar77._12_4_ == iVar58);
              auVar93._0_4_ = auVar93._4_4_;
              auVar93._8_4_ = auVar93._12_4_;
              auVar101._0_4_ = auVar101._4_4_;
              auVar101._8_4_ = auVar101._12_4_;
              auVar77 = auVar93 & auVar80 | auVar101;
              auVar77 = packssdw(auVar77,auVar77);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar77 = packssdw(auVar77 ^ auVar6,auVar77 ^ auVar6);
              if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar51 + 4) = 0x100;
              }
              auVar81 = pshufhw(auVar80,auVar80,0x84);
              auVar94 = pshufhw(auVar93,auVar93,0x84);
              auVar82 = pshufhw(auVar81,auVar101,0x84);
              auVar83._8_4_ = 0xffffffff;
              auVar83._0_8_ = 0xffffffffffffffff;
              auVar83._12_4_ = 0xffffffff;
              auVar83 = (auVar82 | auVar94 & auVar81) ^ auVar83;
              auVar81 = packssdw(auVar83,auVar83);
              if ((auVar81 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar51 + 6) = 0x100;
              }
              auVar81 = auVar67 ^ auVar60;
              iVar97 = -(uint)(iVar98 < auVar81._0_4_);
              auVar85._4_4_ = -(uint)(iVar57 < auVar81._4_4_);
              iVar103 = -(uint)(iVar104 < auVar81._8_4_);
              auVar85._12_4_ = -(uint)(iVar58 < auVar81._12_4_);
              auVar95._4_4_ = iVar97;
              auVar95._0_4_ = iVar97;
              auVar95._8_4_ = iVar103;
              auVar95._12_4_ = iVar103;
              auVar77 = pshuflw(auVar77,auVar95,0xe8);
              auVar84._4_4_ = -(uint)(auVar81._4_4_ == iVar57);
              auVar84._12_4_ = -(uint)(auVar81._12_4_ == iVar58);
              auVar84._0_4_ = auVar84._4_4_;
              auVar84._8_4_ = auVar84._12_4_;
              in_XMM9 = pshuflw(auVar111 & auVar107,auVar84,0xe8);
              in_XMM9 = in_XMM9 & auVar77;
              auVar85._0_4_ = auVar85._4_4_;
              auVar85._8_4_ = auVar85._12_4_;
              auVar77 = pshuflw(auVar77,auVar85,0xe8);
              auVar109._8_4_ = 0xffffffff;
              auVar109._0_8_ = 0xffffffffffffffff;
              auVar109._12_4_ = 0xffffffff;
              auVar109 = (auVar77 | in_XMM9) ^ auVar109;
              auVar77 = packssdw(auVar109,auVar109);
              if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar51 + 8) = 0x100;
              }
              auVar85 = auVar84 & auVar95 | auVar85;
              auVar77 = packssdw(auVar85,auVar85);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar77 = packssdw(auVar77 ^ auVar7,auVar77 ^ auVar7);
              if ((auVar77 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar51 + 10) = 0x100;
              }
              auVar77 = auVar68 ^ auVar60;
              iVar98 = -(uint)(iVar98 < auVar77._0_4_);
              auVar102._4_4_ = -(uint)(iVar57 < auVar77._4_4_);
              iVar104 = -(uint)(iVar104 < auVar77._8_4_);
              auVar102._12_4_ = -(uint)(iVar58 < auVar77._12_4_);
              auVar86._4_4_ = iVar98;
              auVar86._0_4_ = iVar98;
              auVar86._8_4_ = iVar104;
              auVar86._12_4_ = iVar104;
              auVar96._4_4_ = -(uint)(auVar77._4_4_ == iVar57);
              auVar96._12_4_ = -(uint)(auVar77._12_4_ == iVar58);
              auVar96._0_4_ = auVar96._4_4_;
              auVar96._8_4_ = auVar96._12_4_;
              auVar102._0_4_ = auVar102._4_4_;
              auVar102._8_4_ = auVar102._12_4_;
              auVar77 = auVar96 & auVar86 | auVar102;
              auVar77 = packssdw(auVar77,auVar77);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              in_XMM8 = packssdw(auVar77 ^ auVar8,auVar77 ^ auVar8);
              if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar51 + 0xc) = 0x100;
              }
              auVar77 = pshufhw(auVar86,auVar86,0x84);
              auVar111 = pshufhw(auVar96,auVar96,0x84);
              auVar107 = pshufhw(auVar77,auVar102,0x84);
              auVar87._8_4_ = 0xffffffff;
              auVar87._0_8_ = 0xffffffffffffffff;
              auVar87._12_4_ = 0xffffffff;
              auVar87 = (auVar107 | auVar111 & auVar77) ^ auVar87;
              auVar77 = packssdw(auVar87,auVar87);
              if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar25 + lVar51 + 0xe) = 0x100;
              }
              lVar50 = auVar63._8_8_;
              auVar63._0_8_ = auVar63._0_8_ + 8;
              auVar63._8_8_ = lVar50 + 8;
              lVar50 = auVar66._8_8_;
              auVar66._0_8_ = auVar66._0_8_ + 8;
              auVar66._8_8_ = lVar50 + 8;
              lVar50 = auVar67._8_8_;
              auVar67._0_8_ = auVar67._0_8_ + 8;
              auVar67._8_8_ = lVar50 + 8;
              lVar50 = auVar68._8_8_;
              auVar68._0_8_ = auVar68._0_8_ + 8;
              auVar68._8_8_ = lVar50 + 8;
              lVar51 = lVar51 + 0x10;
            } while (uVar43 * 0x10 != lVar51);
          }
          sVar44 = 0;
          uVar11 = 0;
          do {
            if (*(short *)((long)pvVar25 + (ulong)*(byte *)((long)pvVar21 + sVar44) * 2) == 0x100) {
              *(ushort *)((long)pvVar25 + (ulong)*(byte *)((long)pvVar21 + sVar44) * 2) = uVar11;
              uVar11 = uVar11 + 1;
            }
            sVar44 = sVar44 + 1;
          } while (num_commands != sVar44);
          sVar44 = 0;
          do {
            *(undefined1 *)((long)pvVar21 + sVar44) =
                 *(undefined1 *)((long)pvVar25 + (ulong)*(byte *)((long)pvVar21 + sVar44) * 2);
            sVar44 = sVar44 + 1;
          } while (num_commands != sVar44);
          uVar52 = (ulong)uVar11;
          if (uVar11 != 0) {
            lVar51 = 0;
            do {
              memset((void *)((long)pvVar18 + lVar51),0,0xb08);
              *(undefined8 *)((long)pvVar18 + lVar51 + 0xb08) = 0x7ff0000000000000;
              lVar51 = lVar51 + 0xb10;
            } while (uVar52 * 0xb10 != lVar51);
          }
          sVar44 = 0;
          do {
            lVar51 = (ulong)*(byte *)((long)pvVar21 + sVar44) * 0xb10;
            piVar1 = (int *)((long)pvVar18 +
                            (ulong)*(ushort *)((long)local_fe0 + sVar44 * 2) * 4 + lVar51);
            *piVar1 = *piVar1 + 1;
            plVar2 = (long *)((long)pvVar18 + lVar51 + 0xb00);
            *plVar2 = *plVar2 + 1;
            sVar44 = sVar44 + 1;
          } while (num_commands != sVar44);
          lVar30 = lVar30 + 1;
        } while (lVar30 != lVar48);
        BrotliFree(m,pvVar22);
        BrotliFree(m,pvVar23);
        BrotliFree(m,local_fd8);
        BrotliFree(m,pvVar25);
        BrotliFree(m,pvVar18);
        if (pBVar42 == (BlockSplit *)0x0) {
          local_fb8 = (HistogramCommand *)BrotliAllocate(m,0xa5f0);
          puVar24 = (uint32_t *)BrotliAllocate(m,0x3c);
          uVar52 = 0xf;
          sVar44 = 0;
          pvVar18 = (void *)0x0;
          local_ff0 = (uint32_t *)0x0;
          local_1000 = (HistogramCommand *)0x0;
        }
        else {
          sVar44 = (long)pBVar42 * 4;
          local_ff0 = (uint32_t *)BrotliAllocate(m,sVar44);
          pvVar18 = BrotliAllocate(m,sVar44);
          uVar43 = (long)pBVar42 * 0x10 + 0x3f0;
          uVar52 = uVar43 >> 6;
          if (uVar43 < 0x40) {
            puVar24 = (uint32_t *)0x0;
            local_fb8 = (HistogramCommand *)0x0;
          }
          else {
            local_fb8 = (HistogramCommand *)BrotliAllocate(m,uVar52 * 0xb10);
            puVar24 = (uint32_t *)BrotliAllocate(m,uVar52 * 4);
          }
          pBVar14 = (BlockSplit *)0x40;
          if (pBVar42 < (BlockSplit *)0x40) {
            pBVar14 = pBVar42;
          }
          local_1000 = (HistogramCommand *)BrotliAllocate(m,(long)pBVar14 * 0xb10);
        }
        local_fc0 = (HistogramPair *)BrotliAllocate(m,0xc018);
        lVar48 = 0;
        memset(sizes,0,0x100);
        memset(new_clusters,0,0x100);
        memset(symbols,0,0x100);
        memset(remap,0,0x100);
        memset(pvVar18,0,sVar44);
        sVar44 = 0;
        do {
          piVar1 = (int *)((long)pvVar18 + lVar48 * 4);
          *piVar1 = *piVar1 + 1;
          if ((num_commands - 1 == sVar44) ||
             (*(char *)((long)pvVar21 + sVar44) != *(char *)((long)pvVar21 + sVar44 + 1))) {
            lVar48 = lVar48 + 1;
          }
          sVar44 = sVar44 + 1;
        } while (num_commands != sVar44);
        in_stack_ffffffffffffeff0 = pBVar42;
        if (pBVar42 == (BlockSplit *)0x0) {
          local_fa0 = 0;
        }
        else {
          local_f90 = 0;
          local_f98 = (void *)0x0;
          local_ff8 = (void *)0x0;
          local_fa0 = 0;
          local_1008 = 0;
          puVar27 = local_ff0;
          uVar43 = uVar52;
          do {
            pBVar14 = (BlockSplit *)0x40;
            if (pBVar42 < (BlockSplit *)0x40) {
              pBVar14 = pBVar42;
            }
            lVar48 = (long)&pBVar14->num_types + (ulong)(pBVar14 == (BlockSplit *)0x0);
            lVar30 = 0;
            do {
              pHVar26 = local_1000 + lVar30;
              memset(pHVar26,0,0xb08);
              local_1000[lVar30].bit_cost_ = INFINITY;
              if (*(int *)((long)pvVar18 + ((long)local_ff8 + lVar30) * 4) != 0) {
                uVar41 = 0;
                do {
                  pHVar26->data_[*(ushort *)((long)local_fe0 + uVar41 * 2 + local_1008 * 2)] =
                       pHVar26->data_[*(ushort *)((long)local_fe0 + uVar41 * 2 + local_1008 * 2)] +
                       1;
                  uVar41 = uVar41 + 1;
                } while (uVar41 < *(uint *)((long)pvVar18 + ((long)local_ff8 + lVar30) * 4));
                pHVar26->total_count_ = uVar41;
                local_1008 = local_1008 + uVar41;
              }
              dVar53 = BrotliPopulationCostCommand(pHVar26);
              pHVar26->bit_cost_ = dVar53;
              new_clusters[lVar30] = (uint32_t)lVar30;
              symbols[lVar30] = (uint32_t)lVar30;
              sizes[lVar30] = 1;
              lVar30 = lVar30 + 1;
            } while (lVar30 != lVar48);
            sVar44 = (long)in_stack_ffffffffffffeff0 - (long)local_ff8;
            if (0x3f < sVar44) {
              sVar44 = 0x40;
            }
            sVar44 = BrotliHistogramCombineCommand
                               (local_1000,sizes,symbols,new_clusters,local_fc0,sVar44,sVar44,0x40,
                                0x800);
            uVar41 = local_f90 + sVar44;
            if (uVar43 < uVar41) {
              uVar19 = uVar43;
              if (uVar43 == 0) {
                uVar19 = uVar41;
              }
              do {
                uVar46 = uVar19;
                uVar19 = uVar46 * 2;
              } while (uVar46 < uVar41);
              pHVar26 = (HistogramCommand *)BrotliAllocate(m,uVar46 * 0xb10);
              if (uVar43 != 0) {
                memcpy(pHVar26,local_fb8,uVar43 * 0xb10);
              }
              BrotliFree(m,local_fb8);
              local_fb8 = pHVar26;
              uVar43 = uVar46;
            }
            uVar41 = (long)local_f98 + sVar44;
            if (uVar52 < uVar41) {
              uVar19 = uVar52;
              if (uVar52 == 0) {
                uVar19 = uVar41;
              }
              do {
                uVar46 = uVar19;
                uVar19 = uVar46 * 2;
              } while (uVar46 < uVar41);
              __dest = (uint32_t *)BrotliAllocate(m,uVar46 * 4);
              if (uVar52 != 0) {
                memcpy(__dest,puVar24,uVar52 << 2);
              }
              BrotliFree(m,puVar24);
              uVar52 = uVar46;
              puVar24 = __dest;
            }
            if (sVar44 != 0) {
              pHVar26 = local_fb8 + local_f90;
              sVar47 = 0;
              do {
                uVar45 = new_clusters[sVar47];
                memcpy(pHVar26,local_1000 + uVar45,0xb10);
                puVar24[(long)local_f98 + sVar47] = sizes[uVar45];
                remap[new_clusters[sVar47]] = (uint32_t)sVar47;
                sVar47 = sVar47 + 1;
                pHVar26 = pHVar26 + 1;
              } while (sVar44 != sVar47);
              local_f90 = local_f90 + sVar47;
              local_f98 = (void *)((long)local_f98 + sVar47);
            }
            lVar30 = 0;
            do {
              puVar27[lVar30] = remap[symbols[lVar30]] + (int)local_fa0;
              lVar30 = lVar30 + 1;
            } while (lVar48 != lVar30);
            local_fa0 = local_fa0 + sVar44;
            local_ff8 = (void *)((long)local_ff8 + 0x40);
            pBVar42 = (BlockSplit *)&pBVar42[-2].types_alloc_size;
            puVar27 = puVar27 + 0x40;
          } while (local_ff8 < in_stack_ffffffffffffeff0);
        }
        BrotliFree(m,local_1000);
        uVar52 = (local_fa0 >> 1) * local_fa0;
        if (local_fa0 << 6 < uVar52) {
          uVar52 = local_fa0 << 6;
        }
        if (0x800 < uVar52) {
          BrotliFree(m,local_fc0);
          local_fc0 = (HistogramPair *)BrotliAllocate(m,uVar52 * 0x18 + 0x18);
        }
        if (local_fa0 == 0) {
          puVar27 = (uint32_t *)0x0;
        }
        else {
          puVar27 = (uint32_t *)BrotliAllocate(m,local_fa0 * 4);
          auVar60 = _DAT_00176480;
          lVar48 = local_fa0 - 1;
          auVar56._8_4_ = (int)lVar48;
          auVar56._0_8_ = lVar48;
          auVar56._12_4_ = (int)((ulong)lVar48 >> 0x20);
          uVar43 = 0;
          auVar56 = auVar56 ^ _DAT_00176480;
          auVar64 = _DAT_00176470;
          do {
            auVar77 = auVar64 ^ auVar60;
            if ((bool)(~(auVar77._4_4_ == auVar56._4_4_ && auVar56._0_4_ < auVar77._0_4_ ||
                        auVar56._4_4_ < auVar77._4_4_) & 1)) {
              puVar27[uVar43] = (uint32_t)uVar43;
            }
            if ((auVar77._12_4_ != auVar56._12_4_ || auVar77._8_4_ <= auVar56._8_4_) &&
                auVar77._12_4_ <= auVar56._12_4_) {
              puVar27[uVar43 + 1] = (uint32_t)uVar43 + 1;
            }
            uVar43 = uVar43 + 2;
            lVar48 = auVar64._8_8_;
            auVar64._0_8_ = auVar64._0_8_ + 2;
            auVar64._8_8_ = lVar48 + 2;
          } while ((local_fa0 + 1 & 0xfffffffffffffffe) != uVar43);
        }
        sVar44 = BrotliHistogramCombineCommand
                           (local_fb8,puVar24,local_ff0,puVar27,local_fc0,local_fa0,
                            (size_t)in_stack_ffffffffffffeff0,0x100,uVar52);
        BrotliFree(m,local_fc0);
        BrotliFree(m,puVar24);
        if (local_fa0 == 0) {
          local_ff8 = (void *)0x0;
        }
        else {
          local_ff8 = BrotliAllocate(m,local_fa0 << 2);
          memset(local_ff8,0xff,local_fa0 << 2);
        }
        if (in_stack_ffffffffffffeff0 != (BlockSplit *)0x0) {
          iVar98 = 0;
          pBVar42 = (BlockSplit *)0x0;
          local_fd0 = 0;
          do {
            memset(local_b40,0,0xb08);
            local_38 = INFINITY;
            if (*(int *)((long)pvVar18 + (long)pBVar42 * 4) != 0) {
              uVar52 = 0;
              do {
                *(int *)(local_b40 +
                        (ulong)*(ushort *)((long)local_fe0 + uVar52 * 2 + local_fd0 * 2) * 4) =
                     *(int *)(local_b40 +
                             (ulong)*(ushort *)((long)local_fe0 + uVar52 * 2 + local_fd0 * 2) * 4) +
                     1;
                uVar52 = uVar52 + 1;
              } while (uVar52 < *(uint *)((long)pvVar18 + (long)pBVar42 * 4));
              local_fd0 = local_fd0 + uVar52;
              local_40 = uVar52;
            }
            puVar13 = (undefined1 *)0x0;
            if (pBVar42 != (BlockSplit *)0x0) {
              puVar13 = (undefined1 *)((long)&pBVar42[-1].lengths_alloc_size + 7);
            }
            uVar45 = local_ff0[(long)puVar13];
            uVar52 = (ulong)uVar45;
            local_1000 = (HistogramCommand *)
                         BrotliHistogramBitCostDistanceCommand
                                   ((HistogramCommand *)local_b40,local_fb8 + uVar52);
            if (sVar44 != 0) {
              sVar47 = 0;
              do {
                dVar53 = BrotliHistogramBitCostDistanceCommand
                                   ((HistogramCommand *)local_b40,local_fb8 + puVar27[sVar47]);
                if (dVar53 < (double)local_1000) {
                  uVar52 = (ulong)puVar27[sVar47];
                  local_1000 = (HistogramCommand *)dVar53;
                }
                uVar45 = (uint)uVar52;
                sVar47 = sVar47 + 1;
              } while (sVar44 != sVar47);
            }
            local_ff0[(long)pBVar42] = uVar45;
            if (*(int *)((long)local_ff8 + uVar52 * 4) == -1) {
              *(int *)((long)local_ff8 + uVar52 * 4) = iVar98;
              iVar98 = iVar98 + 1;
            }
            pBVar42 = (BlockSplit *)((long)&pBVar42->num_types + 1);
          } while (pBVar42 != in_stack_ffffffffffffeff0);
        }
        BrotliFree(m,puVar27);
        BrotliFree(m,local_fb8);
        pBVar42 = (BlockSplit *)insert_and_copy_split->types_alloc_size;
        if (pBVar42 < in_stack_ffffffffffffeff0) {
          if (pBVar42 == (BlockSplit *)0x0) {
            pBVar42 = in_stack_ffffffffffffeff0;
          }
          do {
            pBVar14 = pBVar42;
            pBVar42 = (BlockSplit *)((long)pBVar14 * 2);
          } while (pBVar14 < in_stack_ffffffffffffeff0);
          puVar16 = (uint8_t *)BrotliAllocate(m,(size_t)pBVar14);
          if (insert_and_copy_split->types_alloc_size != 0) {
            memcpy(puVar16,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
          }
          BrotliFree(m,insert_and_copy_split->types);
          insert_and_copy_split->types = puVar16;
          insert_and_copy_split->types_alloc_size = (size_t)pBVar14;
        }
        pBVar42 = (BlockSplit *)insert_and_copy_split->lengths_alloc_size;
        if (pBVar42 < in_stack_ffffffffffffeff0) {
          if (pBVar42 == (BlockSplit *)0x0) {
            pBVar42 = in_stack_ffffffffffffeff0;
          }
          do {
            pBVar14 = pBVar42;
            pBVar42 = (BlockSplit *)((long)pBVar14 * 2);
          } while (pBVar14 < in_stack_ffffffffffffeff0);
          puVar24 = (uint32_t *)BrotliAllocate(m,(long)pBVar14 * 4);
          if (insert_and_copy_split->lengths_alloc_size != 0) {
            memcpy(puVar24,insert_and_copy_split->lengths,
                   insert_and_copy_split->lengths_alloc_size << 2);
          }
          BrotliFree(m,insert_and_copy_split->lengths);
          insert_and_copy_split->lengths = puVar24;
          insert_and_copy_split->lengths_alloc_size = (size_t)pBVar14;
LAB_001281a9:
          uVar45 = 0;
          sVar44 = 0;
          uVar35 = 0;
          pBVar42 = (BlockSplit *)0x0;
          do {
            uVar35 = uVar35 + *(int *)((long)pvVar18 + (long)pBVar42 * 4);
            if (((BlockSplit *)((long)&in_stack_ffffffffffffeff0[-1].lengths_alloc_size + 7U) ==
                 pBVar42) ||
               (local_ff0[(long)pBVar42] != local_ff0[(long)((long)&pBVar42->num_types + 1)])) {
              uVar38 = uVar45 & 0xff;
              uVar3 = *(uint *)((long)local_ff8 + (ulong)local_ff0[(long)pBVar42] * 4);
              bVar39 = (byte)uVar3;
              insert_and_copy_split->types[sVar44] = bVar39;
              bVar37 = (byte)uVar45;
              uVar45 = uVar3;
              if (bVar39 < bVar37) {
                uVar45 = uVar38;
              }
              insert_and_copy_split->lengths[sVar44] = uVar35;
              sVar44 = sVar44 + 1;
              uVar35 = 0;
            }
            pBVar42 = (BlockSplit *)((long)&pBVar42->num_types + 1);
          } while (in_stack_ffffffffffffeff0 != pBVar42);
          sVar47 = (ulong)(uVar45 & 0xff) + 1;
        }
        else {
          if (in_stack_ffffffffffffeff0 != (BlockSplit *)0x0) goto LAB_001281a9;
          sVar47 = 1;
          sVar44 = 0;
        }
        insert_and_copy_split->num_blocks = sVar44;
        insert_and_copy_split->num_types = sVar47;
        BrotliFree(m,local_ff8);
        BrotliFree(m,pvVar18);
        BrotliFree(m,local_ff0);
        BrotliFree(m,pvVar21);
      }
    }
    else {
LAB_00126d11:
      BrotliSplitBlockCommandsFromStored
                (m,cmds,num_commands,pos,(size_t)pHVar40,insert_and_copy_split,
                 cmds_block_splits_decoder,current_block_cmds);
    }
    BrotliFree(m,local_fe0);
    dVar53 = extraout_XMM0_Qa;
    if (num_commands != 0) {
      puVar17 = (uint16_t *)BrotliAllocate(m,num_commands * 2);
      puVar49 = &cmds->dist_prefix_;
      sVar44 = 0;
      do {
        if (((*(uint *)(puVar49 + -5) & 0x1ffffff) != 0) && (0x7f < puVar49[-1])) {
          puVar17[sVar44] = *puVar49 & 0x3ff;
          sVar44 = sVar44 + 1;
        }
        puVar49 = puVar49 + 8;
        num_commands = num_commands - 1;
        dVar53 = extraout_XMM0_Qa_00;
      } while (num_commands != 0);
      goto LAB_00126db6;
    }
  }
  puVar17 = (uint16_t *)0x0;
  sVar44 = 0;
LAB_00126db6:
  SplitByteVectorDistance
            (m,puVar17,sVar44,sVar28,(size_t)params,(size_t)dist_split,dVar53,
             in_stack_ffffffffffffefe8,in_stack_ffffffffffffeff0);
  BrotliFree(m,puVar17);
  return;
}

Assistant:

void BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split,
                      const BlockSplitFromDecoder* literals_block_splits_decoder,
                      size_t* current_block_literals,
                      const BlockSplitFromDecoder* cmds_block_splits_decoder,
                      size_t* current_block_cmds) {

  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literals)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);

    /* Create the block split on the array of literals.
-       Literal histograms have alphabet size 256.
       If have block splits from decoder then use them. */
    if (literals_block_splits_decoder == NULL) {
      SplitByteVectorLiteral(
          m, literals, literals_count,
          kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
          kLiteralStrideLength, kLiteralBlockSwitchCost, params,
          literal_split);
    } else {
      BrotliSplitBlockLiteralsFromStored(m, cmds, num_commands, pos, mask,
                                         literal_split,
                                         literals_block_splits_decoder,
                                         current_block_literals);
    }
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(insert_and_copy_codes)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }

    /* Create the block split on the array of command prefixes.
       If have block splits from decoder then use them. */
    if (cmds_block_splits_decoder == NULL) {
      SplitByteVectorCommand(
          m, insert_and_copy_codes, num_commands,
          kSymbolsPerCommandHistogram, kMaxCommandHistograms,
          kCommandStrideLength, kCommandBlockSwitchCost, params,
          insert_and_copy_split);
    } else {
      BrotliSplitBlockCommandsFromStored(m, cmds, num_commands, pos, mask,
                                         insert_and_copy_split,
                                         cmds_block_splits_decoder,
                                         current_block_cmds);
    }
    if (BROTLI_IS_OOM(m)) return;
    /* TODO: reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_prefixes)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_ & 0x3FF;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    if (literals_block_splits_decoder == NULL) {
      SplitByteVectorDistance(
          m, distance_prefixes, j,
          kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
          kCommandStrideLength, kDistanceBlockSwitchCost, params,
          dist_split);
    } else {
      SplitByteVectorDistance(
          m, distance_prefixes, j,
          kSymbolsPerDistanceHistogram, 1,
          kCommandStrideLength, kDistanceBlockSwitchCost, params,
          dist_split);
    }
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}